

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzgeom_utility.h
# Opt level: O3

int ProjectBissectionInParametricDomain<pzgeom::TPZEllipse3D>
              (TPZVec<double> *qsi,TPZVec<double> *qsiInDomain)

{
  byte bVar1;
  bool bVar2;
  int sideto;
  TPZVec<double> *this;
  double dVar3;
  TPZVec<double> InnPt;
  TPZVec<double> OutPt;
  TPZManVector<double,_3> pt2;
  TPZManVector<double,_3> pt1;
  TPZTransform<double> T2;
  TPZTransform<double> T1;
  int local_42c;
  TPZVec<double> local_428;
  double local_408;
  TPZVec<double> local_400;
  TPZManVector<double,_3> local_3e0;
  TPZManVector<double,_3> local_3a8;
  TPZTransform<double> local_370;
  TPZTransform<double> local_1d0;
  
  (*qsiInDomain->_vptr_TPZVec[3])(qsiInDomain,1);
  bVar2 = pztopology::TPZLine::IsInParametricDomain(qsi,0.0);
  if (bVar2) {
    TPZVec<double>::operator=(qsiInDomain,qsi);
    local_42c = 2;
  }
  else {
    TPZVec<double>::TPZVec(&local_400,qsi);
    TPZVec<double>::TPZVec(&local_428,1);
    pztopology::TPZLine::CenterPoint(2,&local_428);
    while( true ) {
      dVar3 = (*local_428.fStore - *local_400.fStore) * (*local_428.fStore - *local_400.fStore) +
              0.0;
      if (dVar3 < 0.0) {
        dVar3 = sqrt(dVar3);
      }
      else {
        dVar3 = SQRT(dVar3);
      }
      if (dVar3 <= 1e-10) break;
      *qsiInDomain->fStore = (*local_428.fStore + *local_400.fStore) * 0.5;
      bVar2 = pztopology::TPZLine::IsInParametricDomain(qsiInDomain,0.0);
      this = &local_400;
      if (bVar2) {
        this = &local_428;
      }
      TPZVec<double>::operator=(this,qsiInDomain);
    }
    TPZManVector<double,_3>::TPZManVector(&local_3a8,1);
    TPZManVector<double,_3>::TPZManVector(&local_3e0,1);
    local_42c = -1;
    sideto = 0;
    bVar1 = 1;
    do {
      pztopology::TPZLine::SideToSideTransform(&local_1d0,2,sideto);
      TPZTransform<double>::Apply(&local_1d0,qsiInDomain,&local_3a8.super_TPZVec<double>);
      pztopology::TPZLine::SideToSideTransform(&local_370,sideto,2);
      TPZTransform<double>::Apply
                (&local_370,&local_3a8.super_TPZVec<double>,&local_3e0.super_TPZVec<double>);
      dVar3 = *qsiInDomain->fStore - *local_3e0.super_TPZVec<double>.fStore;
      dVar3 = dVar3 * dVar3 + 0.0;
      if (dVar3 < 0.0) {
        local_408 = sqrt(dVar3);
      }
      else {
        local_408 = SQRT(dVar3);
      }
      if (local_408 < 1e-10) {
        TPZVec<double>::operator=(qsiInDomain,&local_3e0.super_TPZVec<double>);
        local_42c = sideto;
      }
      bVar2 = 1e-10 <= local_408;
      TPZTransform<double>::~TPZTransform(&local_370);
      TPZTransform<double>::~TPZTransform(&local_1d0);
      sideto = 1;
      bVar2 = (bool)(bVar2 & bVar1);
      bVar1 = 0;
    } while (bVar2);
    TPZManVector<double,_3>::~TPZManVector(&local_3e0);
    TPZManVector<double,_3>::~TPZManVector(&local_3a8);
    local_428._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813df0;
    if (local_428.fStore != (double *)0x0) {
      operator_delete__(local_428.fStore);
    }
    local_400._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813df0;
    if (local_400.fStore != (double *)0x0) {
      operator_delete__(local_400.fStore);
    }
  }
  return local_42c;
}

Assistant:

int ProjectBissectionInParametricDomain(TPZVec<REAL> &qsi, TPZVec<REAL> &qsiInDomain){
    const int nsides = Topology::NSides;
    const int dim = Topology::Dimension;
    
    qsiInDomain.Resize(dim);
    
    if(Topology::IsInParametricDomain(qsi,0.))///it is already in the domain
    {
        qsiInDomain = qsi;
        return nsides-1;
    }
    
    REAL tol = 1.e-10;
    
    ///first, will be made a project to center direction
    TPZVec<REAL> OutPt(qsi), InnPt(dim);
    Topology::CenterPoint(nsides-1,InnPt);
    
    REAL dist = 0.;
    for(int c = 0; c < dim; c++)
    {
        dist += (InnPt[c] - OutPt[c])*(InnPt[c] - OutPt[c]);
    }
    dist = sqrt(dist);
    
    while(dist > tol)
    {
        for(int c = 0; c < dim; c++)
        {
            qsiInDomain[c] = (InnPt[c] + OutPt[c])/2.;
        }
        if(Topology::IsInParametricDomain(qsiInDomain,0.))
        {
            InnPt = qsiInDomain;
        }
        else
        {
            OutPt = qsiInDomain;
        }
        dist = 0.;
        for(int c = 0; c < dim; c++)
        {
            dist += (InnPt[c] - OutPt[c])*(InnPt[c] - OutPt[c]);
        }
        dist = sqrt(dist);
    }
    
    ///found in witch side the projection belongs
    int winnerSide = -1;
    TPZManVector<REAL,3> pt1(dim), pt2(dim);
    for(int is = 0; is < nsides-1; is++)
    {
        ///Go orthogonally from \f$ NSides-1 \f$ to side is
        TPZTransform<> T1 = Topology::SideToSideTransform(nsides-1, is);
        T1.Apply(qsiInDomain,pt1);
        
        ///Come back from side is to \f$ NSides-1 \f$
        TPZTransform<> T2 = Topology::SideToSideTransform(is,nsides-1);
        T2.Apply(pt1,pt2);
        
        ///Compare ptInDomain to transformed point
        dist = 0.;
        for(int c = 0; c < dim; c++)
        {
            dist += (qsiInDomain[c]-pt2[c]) * (qsiInDomain[c]-pt2[c]);
        }//i
        dist = sqrt(dist);
        
        ///Closest side
        if(dist < tol)
        {
            winnerSide = is;
            qsiInDomain = pt2;
            break;
        }
    }//for is
    
    return winnerSide;
    
}